

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O2

HullError __thiscall HullLibrary::ReleaseResult(HullLibrary *this,HullResult *result)

{
  if ((result->m_OutputVertices).m_size != 0) {
    result->mNumOutputVertices = 0;
    btAlignedObjectArray<btVector3>::clear(&result->m_OutputVertices);
  }
  if ((result->m_Indices).m_size != 0) {
    result->mNumIndices = 0;
    btAlignedObjectArray<unsigned_int>::clear(&result->m_Indices);
  }
  return QE_OK;
}

Assistant:

HullError HullLibrary::ReleaseResult(HullResult &result) // release memory allocated for this result, we are done with it.
{
	if ( result.m_OutputVertices.size())
	{
		result.mNumOutputVertices=0;
		result.m_OutputVertices.clear();
	}
	if ( result.m_Indices.size() )
	{
		result.mNumIndices=0;
		result.m_Indices.clear();
	}
	return QE_OK;
}